

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t archive_read_format_tar_cleanup(archive_read *a)

{
  tar *tar;
  
  tar = (tar *)a->format->data;
  gnu_clear_sparse_list(tar);
  archive_string_free((archive_string *)tar);
  archive_string_free(&tar->entry_pathname);
  archive_string_free(&tar->entry_pathname_override);
  archive_string_free(&tar->entry_linkpath);
  archive_string_free(&tar->entry_uname);
  archive_string_free(&tar->entry_gname);
  archive_string_free(&tar->line);
  archive_string_free(&tar->pax_global);
  archive_string_free(&tar->pax_header);
  archive_string_free(&tar->longname);
  archive_string_free(&tar->longlink);
  archive_string_free(&tar->localname);
  free(tar);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_tar_cleanup(struct archive_read *a)
{
	struct tar *tar;

	tar = (struct tar *)(a->format->data);
	gnu_clear_sparse_list(tar);
	archive_string_free(&tar->acl_text);
	archive_string_free(&tar->entry_pathname);
	archive_string_free(&tar->entry_pathname_override);
	archive_string_free(&tar->entry_linkpath);
	archive_string_free(&tar->entry_uname);
	archive_string_free(&tar->entry_gname);
	archive_string_free(&tar->line);
	archive_string_free(&tar->pax_global);
	archive_string_free(&tar->pax_header);
	archive_string_free(&tar->longname);
	archive_string_free(&tar->longlink);
	archive_string_free(&tar->localname);
	free(tar);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}